

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl.cpp
# Opt level: O1

void __thiscall DBOPL::change_sustainlevel(DBOPL *this,Bitu regbase,op_type *op_pt)

{
  byte bVar1;
  double dVar2;
  
  bVar1 = this->adlibreg[regbase + 0x80] >> 4;
  dVar2 = 0.0;
  if (bVar1 != 0xf) {
    dVar2 = exp2((double)bVar1 * -0.5);
  }
  op_pt->sustain_level = dVar2;
  return;
}

Assistant:

void DBOPL::change_sustainlevel(Bitu regbase, op_type* op_pt) {
	Bits sustainlevel = adlibreg[ARC_SUSL_RELR+regbase]>>4;
	// sustainlevel should be 0.0 when sustainlevel==15 (max)
	if (sustainlevel<15) {
		op_pt->sustain_level = (fltype)(pow(FL2,(fltype)sustainlevel * (-FL05)));
	} else {
		op_pt->sustain_level = 0.0;
	}
}